

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

DBErrors __thiscall wallet::CWallet::LoadWallet(CWallet *this)

{
  long lVar1;
  bool bVar2;
  DBErrors DVar3;
  uint uVar4;
  WalletDatabase *pWVar5;
  pointer pSVar6;
  char *in_RDI;
  long in_FS_OFFSET;
  pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>
  *spk_man_pair;
  map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
  *__range3;
  DBErrors nLoadWalletRet;
  iterator __end3;
  iterator __begin3;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock50;
  CWallet *in_stack_000000a8;
  WalletBatch *in_stack_000000b0;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  WalletDatabase *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  undefined4 uVar7;
  __atomic_base<unsigned_long> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  char *in_stack_ffffffffffffff80;
  int line;
  char *file;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *in_stack_ffffffffffffff98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  file = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
  ;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (in_stack_ffffffffffffff98,
             (AnnotatedMixin<std::recursive_mutex> *)
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
             ,in_RDI,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
             SUB41((uint)in_stack_ffffffffffffff78 >> 0x18,0));
  line = (int)((ulong)in_RDI >> 0x20);
  std::
  map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
  ::empty((map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
           *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  inline_assertion_check<true,bool>
            ((bool *)in_stack_ffffffffffffff98,file,line,in_stack_ffffffffffffff80,
             (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  std::__atomic_base::operator_cast_to_unsigned_long(in_stack_ffffffffffffff70);
  inline_assertion_check<true,bool>
            ((bool *)in_stack_ffffffffffffff98,file,line,in_stack_ffffffffffffff80,
             (char *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  GetDatabase((CWallet *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  WalletBatch::WalletBatch
            ((WalletBatch *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f);
  DVar3 = WalletBatch::LoadWallet(in_stack_000000b0,in_stack_000000a8);
  WalletBatch::~WalletBatch
            ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  if (DVar3 == NEED_REWRITE) {
    pWVar5 = GetDatabase((CWallet *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    uVar4 = (*pWVar5->_vptr_WalletDatabase[5])(pWVar5,"\x04pool");
    uVar7 = CONCAT13((char)uVar4,(int3)in_stack_ffffffffffffff6c);
    if ((uVar4 & 1) != 0) {
      std::
      map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
      ::begin((map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
               *)in_stack_ffffffffffffff60);
      std::
      map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
      ::end((map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
             *)in_stack_ffffffffffffff60);
      while (bVar2 = std::operator==((_Self *)CONCAT44(uVar7,in_stack_ffffffffffffff68),
                                     (_Self *)in_stack_ffffffffffffff60), ((bVar2 ^ 0xffU) & 1) != 0
            ) {
        std::
        _Rb_tree_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
        ::operator*((_Rb_tree_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
                     *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
        pSVar6 = std::
                 unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                 ::operator->((unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>
                               *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
        (*pSVar6->_vptr_ScriptPubKeyMan[0x10])();
        std::
        _Rb_tree_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
        ::operator++((_Rb_tree_iterator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      }
    }
  }
  bVar2 = std::
          map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
          ::empty((map<uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>,_std::less<uint256>,_std::allocator<std::pair<const_uint256,_std::unique_ptr<wallet::ScriptPubKeyMan,_std::default_delete<wallet::ScriptPubKeyMan>_>_>_>_>
                   *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  if (bVar2) {
    bVar2 = std::
            map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
            ::empty((map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
                     *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    if (!bVar2) {
      __assert_fail("m_external_spk_managers.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                    ,0x947,"DBErrors wallet::CWallet::LoadWallet()");
    }
    bVar2 = std::
            map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
            ::empty((map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
                     *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
    if (!bVar2) {
      __assert_fail("m_internal_spk_managers.empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                    ,0x948,"DBErrors wallet::CWallet::LoadWallet()");
    }
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return DVar3;
}

Assistant:

DBErrors CWallet::LoadWallet()
{
    LOCK(cs_wallet);

    Assert(m_spk_managers.empty());
    Assert(m_wallet_flags == 0);
    DBErrors nLoadWalletRet = WalletBatch(GetDatabase()).LoadWallet(this);
    if (nLoadWalletRet == DBErrors::NEED_REWRITE)
    {
        if (GetDatabase().Rewrite("\x04pool"))
        {
            for (const auto& spk_man_pair : m_spk_managers) {
                spk_man_pair.second->RewriteDB();
            }
        }
    }

    if (m_spk_managers.empty()) {
        assert(m_external_spk_managers.empty());
        assert(m_internal_spk_managers.empty());
    }

    return nLoadWalletRet;
}